

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::SetGlobalGenerator(cmake *this,cmGlobalGenerator *gg)

{
  char *pcVar1;
  char *__s;
  char *__s_00;
  string env;
  string local_48;
  
  if (gg != (cmGlobalGenerator *)0x0) {
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CC=","");
      if ((this->CCEnvironment)._M_string_length != 0) {
        std::__cxx11::string::_M_append
                  ((char *)&local_48,(ulong)(this->CCEnvironment)._M_dataplus._M_p);
      }
      cmsys::SystemTools::PutEnv(&local_48);
      std::__cxx11::string::_M_replace
                ((ulong)&local_48,0,(char *)local_48._M_string_length,0x4fe62e);
      if ((this->CXXEnvironment)._M_string_length != 0) {
        std::__cxx11::string::_M_append
                  ((char *)&local_48,(ulong)(this->CXXEnvironment)._M_dataplus._M_p);
      }
      cmsys::SystemTools::PutEnv(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    this->GlobalGenerator = gg;
    cmSystemTools::s_ForceUnixPaths = gg->ForceUnixPaths;
    __s = getenv("CXX");
    __s_00 = getenv("CC");
    pcVar1 = (char *)(this->CXXEnvironment)._M_string_length;
    if (__s == (char *)0x0) {
      __s = "";
    }
    else {
      strlen(__s);
    }
    std::__cxx11::string::_M_replace((ulong)&this->CXXEnvironment,0,pcVar1,(ulong)__s);
    pcVar1 = (char *)(this->CCEnvironment)._M_string_length;
    if (__s_00 == (char *)0x0) {
      __s_00 = "";
    }
    else {
      strlen(__s_00);
    }
    std::__cxx11::string::_M_replace((ulong)&this->CCEnvironment,0,pcVar1,(ulong)__s_00);
    return;
  }
  cmSystemTools::Error
            ("Error SetGlobalGenerator called with null",(char *)0x0,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmake::SetGlobalGenerator(cmGlobalGenerator *gg)
{
  if(!gg)
    {
    cmSystemTools::Error("Error SetGlobalGenerator called with null");
    return;
    }
  // delete the old generator
  if (this->GlobalGenerator)
    {
    delete this->GlobalGenerator;
    // restore the original environment variables CXX and CC
    // Restore CC
    std::string env = "CC=";
    if(!this->CCEnvironment.empty())
      {
      env += this->CCEnvironment;
      }
    cmSystemTools::PutEnv(env);
    env = "CXX=";
    if(!this->CXXEnvironment.empty())
      {
      env += this->CXXEnvironment;
      }
    cmSystemTools::PutEnv(env);
    }

  // set the new
  this->GlobalGenerator = gg;

  // set the global flag for unix style paths on cmSystemTools as soon as
  // the generator is set.  This allows gmake to be used on windows.
  cmSystemTools::SetForceUnixPaths
    (this->GlobalGenerator->GetForceUnixPaths());

  // Save the environment variables CXX and CC
  const char* cxx = getenv("CXX");
  const char* cc = getenv("CC");
  if(cxx)
    {
    this->CXXEnvironment = cxx;
    }
  else
    {
    this->CXXEnvironment = "";
    }
  if(cc)
    {
    this->CCEnvironment = cc;
    }
  else
    {
    this->CCEnvironment = "";
    }
}